

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xer_decoder.c
# Opt level: O0

int xer_skip_unknown(xer_check_tag_e tcv,ber_tlv_len_t *depth)

{
  long lVar1;
  ber_tlv_len_t *depth_local;
  xer_check_tag_e tcv_local;
  
  if (tcv == XCT_OPENING) {
LAB_0016cda9:
    *depth = *depth + 1;
    return 0;
  }
  if (tcv != XCT_CLOSING) {
    if (tcv == XCT_BOTH) {
      return 0;
    }
    if (tcv == XCT_UNKNOWN_OP) goto LAB_0016cda9;
    if (tcv != XCT_UNKNOWN_CL) {
      if (tcv == XCT_UNKNOWN_BO) {
        return 0;
      }
      return -1;
    }
  }
  lVar1 = *depth;
  *depth = lVar1 + -1;
  if (lVar1 + -1 != 0) {
    return 0;
  }
  if (tcv != XCT_CLOSING) {
    return 1;
  }
  return 2;
}

Assistant:

int
xer_skip_unknown(xer_check_tag_e tcv, ber_tlv_len_t *depth) {
	assert(*depth > 0);
	switch(tcv) {
	case XCT_BOTH:
	case XCT_UNKNOWN_BO:
		/* These negate each other. */
		return 0;
	case XCT_OPENING:
	case XCT_UNKNOWN_OP:
		++(*depth);
		return 0;
	case XCT_CLOSING:
	case XCT_UNKNOWN_CL:
		if(--(*depth) == 0)
			return (tcv == XCT_CLOSING) ? 2 : 1;
		return 0;
	default:
		return -1;
	}
}